

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

void xmlXPathConcatFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlXPathObjectPtr obj;
  xmlXPathObjectPtr obj_00;
  xmlChar *pxVar1;
  int iStack_40;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs < 2) {
    iStack_40 = 0xc;
  }
  else {
    if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type != XPATH_STRING)) {
      xmlXPathStringFunction(ctxt,1);
    }
    obj = valuePop(ctxt);
    if ((obj == (xmlXPathObjectPtr)0x0) || (obj->type != XPATH_STRING)) {
      xmlXPathReleaseObject(ctxt->context,obj);
      return;
    }
    while( true ) {
      if (nargs < 2) {
        valuePush(ctxt,obj);
        return;
      }
      if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type != XPATH_STRING)) {
        xmlXPathStringFunction(ctxt,1);
      }
      obj_00 = valuePop(ctxt);
      if ((obj_00 == (xmlXPathObjectPtr)0x0) || (obj_00->type != XPATH_STRING)) break;
      pxVar1 = xmlStrcat(obj_00->stringval,obj->stringval);
      if (pxVar1 == (xmlChar *)0x0) {
        xmlXPathPErrMemory(ctxt);
      }
      obj_00->stringval = obj->stringval;
      obj->stringval = pxVar1;
      xmlXPathReleaseObject(ctxt->context,obj_00);
      nargs = nargs + -1;
    }
    xmlXPathReleaseObject(ctxt->context,obj_00);
    xmlXPathReleaseObject(ctxt->context,obj);
    iStack_40 = 0xb;
  }
  xmlXPathErr(ctxt,iStack_40);
  return;
}

Assistant:

void
xmlXPathConcatFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr cur, newobj;
    xmlChar *tmp;

    if (ctxt == NULL) return;
    if (nargs < 2) {
	CHECK_ARITY(2);
    }

    CAST_TO_STRING;
    cur = valuePop(ctxt);
    if ((cur == NULL) || (cur->type != XPATH_STRING)) {
	xmlXPathReleaseObject(ctxt->context, cur);
	return;
    }
    nargs--;

    while (nargs > 0) {
	CAST_TO_STRING;
	newobj = valuePop(ctxt);
	if ((newobj == NULL) || (newobj->type != XPATH_STRING)) {
	    xmlXPathReleaseObject(ctxt->context, newobj);
	    xmlXPathReleaseObject(ctxt->context, cur);
	    XP_ERROR(XPATH_INVALID_TYPE);
	}
	tmp = xmlStrcat(newobj->stringval, cur->stringval);
        if (tmp == NULL)
            xmlXPathPErrMemory(ctxt);
	newobj->stringval = cur->stringval;
	cur->stringval = tmp;
	xmlXPathReleaseObject(ctxt->context, newobj);
	nargs--;
    }
    valuePush(ctxt, cur);
}